

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall
cmCTestScriptHandler::RunConfigurationScript
          (cmCTestScriptHandler *this,string *total_script_arg,bool pscope)

{
  bool bVar1;
  cmCTest *pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  int iVar4;
  rep rVar5;
  ostream *poVar6;
  undefined7 in_register_00000011;
  char *local_1d0 [4];
  SaveRestoreEnvironment sre;
  ostringstream cmCTestLog_msg;
  
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(&sre);
  rVar5 = std::chrono::_V2::steady_clock::now();
  (this->ScriptStartTime).__d.__r = rVar5;
  if ((int)CONCAT71(in_register_00000011,pscope) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Executing Script: ");
    poVar6 = std::operator<<(poVar6,(string *)total_script_arg);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x1ef,local_1d0[0],false);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar4 = ExecuteScript(this,total_script_arg);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg,"Reading Script: ");
    poVar6 = std::operator<<(poVar6,(string *)total_script_arg);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x1eb,local_1d0[0],false);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar4 = ReadInScript(this,total_script_arg);
  }
  if (iVar4 == 0) {
    this_00 = (this->Makefile)._M_t.
              super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
              super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
              super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    iVar4 = 0;
    if (this_00 != (cmMakefile *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,"CTEST_RUN_CURRENT_SCRIPT",(allocator<char> *)local_1d0);
      bVar3 = cmMakefile::IsOn(this_00,(string *)&cmCTestLog_msg);
      bVar1 = this->ShouldRunCurrentScript;
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if ((bVar3 & bVar1) == 1) {
        iVar4 = RunCurrentScript(this);
      }
    }
  }
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(&sre);
  return iVar4;
}

Assistant:

int cmCTestScriptHandler::RunConfigurationScript(
  const std::string& total_script_arg, bool pscope)
{
#ifndef CMAKE_BOOTSTRAP
  cmSystemTools::SaveRestoreEnvironment sre;
#endif

  int result;

  this->ScriptStartTime = std::chrono::steady_clock::now();

  // read in the script
  if (pscope) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Reading Script: " << total_script_arg << std::endl);
    result = this->ReadInScript(total_script_arg);
  } else {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Executing Script: " << total_script_arg << std::endl);
    result = this->ExecuteScript(total_script_arg);
  }
  if (result) {
    return result;
  }

  // only run the current script if we should
  if (this->Makefile && this->Makefile->IsOn("CTEST_RUN_CURRENT_SCRIPT") &&
      this->ShouldRunCurrentScript) {
    return this->RunCurrentScript();
  }
  return result;
}